

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O3

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  uchar uVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  FT_Memory memory;
  FT_Stream stream_00;
  uchar *puVar5;
  FT_GlyphSlot_conflict pFVar6;
  FT_Library __s2;
  FT_ULong count;
  FT_Bitmap_Size *pFVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  FT_Int FVar11;
  undefined1 auVar12 [8];
  FT_Error FVar13;
  int iVar14;
  FT_Pointer pvVar15;
  FT_String *pFVar16;
  size_t sVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  FT_Face pFVar21;
  long lVar22;
  FT_Face pFVar23;
  FT_Face pFVar24;
  undefined8 *puVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_2d8 [8];
  FT_Open_Args args;
  code *local_268;
  code *local_258;
  code *local_250;
  FT_Face local_240;
  FT_ULong FStack_238;
  char local_230;
  FT_Int local_228;
  undefined1 local_220 [32];
  int local_200;
  long local_1f8;
  code *local_1c8;
  uint local_1c0;
  FT_Pos local_1b8 [5];
  FT_GlyphSlot_conflict local_190;
  code *local_160;
  FT_Generic_Finalizer local_158 [3];
  long local_140;
  FT_Size local_130;
  FT_CharMap local_128;
  code *local_100;
  undefined1 local_f8 [88];
  code *local_a0;
  FT_Parameter *local_98;
  FT_String *local_90;
  FT_Int local_84;
  ulong local_80;
  FT_Face local_78 [2];
  int local_68;
  FT_Face local_60;
  FT_Face local_58;
  FT_Face local_50;
  FT_Pointer local_48;
  FT_Face local_40;
  FT_Int local_38;
  FT_Error local_34;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  pvVar15 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)pvVar15;
  local_90 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = local_90;
  if (local_90 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  local_98 = params;
  local_84 = face_index;
  memset(local_2d8,0,0x240);
  pFVar16 = (FT_String *)ft_mem_alloc(memory,0xc,&local_34);
  t42face[3].style_name = pFVar16;
  FVar13 = local_34;
  if (local_34 == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    local_38 = num_params;
    (*(code *)**(undefined8 **)(local_90 + 8))(local_2d8,0,0);
    local_240 = (FT_Face)0x0;
    FStack_238 = 0;
    local_230 = '\0';
    FVar13 = FT_Stream_Seek(stream_00,0);
    local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,FVar13);
    if (FVar13 == 0) {
      FVar13 = FT_Stream_EnterFrame(stream_00,0x11);
      local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,FVar13);
      if (FVar13 != 0) goto LAB_00234c7a;
      puVar5 = stream_00->cursor;
      auVar26[0] = -(*puVar5 == '%');
      auVar26[1] = -(puVar5[1] == '!');
      auVar26[2] = -(puVar5[2] == 'P');
      auVar26[3] = -(puVar5[3] == 'S');
      auVar26[4] = -(puVar5[4] == '-');
      auVar26[5] = -(puVar5[5] == 'T');
      auVar26[6] = -(puVar5[6] == 'r');
      auVar26[7] = -(puVar5[7] == 'u');
      auVar26[8] = -(puVar5[8] == 'e');
      auVar26[9] = -(puVar5[9] == 'T');
      auVar26[10] = -(puVar5[10] == 'y');
      auVar26[0xb] = -(puVar5[0xb] == 'p');
      auVar26[0xc] = -(puVar5[0xc] == 'e');
      auVar26[0xd] = -(puVar5[0xd] == 'F');
      auVar26[0xe] = -(puVar5[0xe] == 'o');
      auVar26[0xf] = -(puVar5[0xf] == 'n');
      auVar27[0] = -(puVar5[0x10] == 't');
      auVar27[1] = 0xff;
      auVar27[2] = 0xff;
      auVar27[3] = 0xff;
      auVar27[4] = 0xff;
      auVar27[5] = 0xff;
      auVar27[6] = 0xff;
      auVar27[7] = 0xff;
      auVar27[8] = 0xff;
      auVar27[9] = 0xff;
      auVar27[10] = 0xff;
      auVar27[0xb] = 0xff;
      auVar27[0xc] = 0xff;
      auVar27[0xd] = 0xff;
      auVar27[0xe] = 0xff;
      auVar27[0xf] = 0xff;
      auVar27 = auVar27 & auVar26;
      if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) {
        local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,2);
        FT_Stream_ExitFrame(stream_00);
        FVar13 = 2;
        goto LAB_00234c7a;
      }
      FT_Stream_ExitFrame(stream_00);
      FVar13 = FT_Stream_Seek(stream_00,0);
      local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,FVar13);
      if (FVar13 != 0) goto LAB_00234c7a;
      count = stream_00->size;
      if (stream_00->read != (FT_Stream_IoFunc)0x0) {
        local_240 = (FT_Face)ft_mem_alloc(memory,count,(FT_Error *)local_78);
        FStack_238 = 0;
        FVar13 = (int)local_78[0];
        if ((int)local_78[0] == 0) {
          FVar13 = FT_Stream_Read(stream_00,(FT_Byte *)local_240,count);
          local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,FVar13);
          if (FVar13 == 0) goto LAB_002355e2;
        }
        goto LAB_00234c7a;
      }
      local_240 = (FT_Face)(stream_00->base + stream_00->pos);
      local_230 = '\x01';
      FVar13 = FT_Stream_Skip(stream_00,count);
      local_78[0] = (FT_Face)CONCAT44(local_78[0]._4_4_,FVar13);
      FStack_238 = count;
      if (FVar13 != 0) goto LAB_00234c7a;
LAB_002355e2:
      args._0_8_ = local_240;
      local_34 = 0;
      FStack_238 = count;
      pFVar21 = local_240;
LAB_00234cc4:
      local_240 = pFVar21;
      num_params = local_38;
      pFVar21 = (FT_Face)((long)&local_240->num_faces + FStack_238);
      args.memory_size._0_4_ = 0;
      local_2d8 = (undefined1  [8])local_240;
      args.memory_base = (FT_Byte *)pFVar21;
      (*(code *)args._48_8_)(local_2d8);
      local_48 = pvVar15;
      if ((ulong)local_2d8 < pFVar21) {
        local_58 = (FT_Face)&t42face[2].extensions;
        local_40 = (FT_Face)&t42face[1].num_fixed_sizes;
        local_60 = t42face + 1;
        local_50 = pFVar21;
        do {
          pFVar21 = local_50;
          uVar1 = (uchar)*(FT_Long *)local_2d8;
          if ((uVar1 == 'F') && ((FT_Face)((long)((long)local_2d8 + 0x18) + 1U) < local_50)) {
            iVar14 = strncmp((char *)local_2d8,"FontDirectory",0xd);
            if (iVar14 == 0) {
              (*(code *)args.params)(local_2d8);
              (*(code *)args._48_8_)(local_2d8);
              auVar12 = local_2d8;
              if ((ulong)local_2d8 < pFVar21) {
                do {
                  if ((((uchar)*(FT_Long *)local_2d8 == 'k') &&
                      ((FT_Face)((long)(FT_Long *)local_2d8 + 5U) < pFVar21)) &&
                     (iVar14 = strncmp((char *)local_2d8,"known",5), iVar14 == 0)) {
                    (*(code *)args.params)(local_2d8);
                    (*local_268)(local_2d8,local_78);
                    if (local_68 == 3) {
                      auVar12 = local_2d8;
                    }
                    break;
                  }
                  (*(code *)args.params)(local_2d8);
                  pvVar15 = local_48;
                  num_params = local_38;
                  FVar13 = (int)args.memory_size;
                  if ((int)args.memory_size != 0) goto LAB_002351db;
                  (*(code *)args._48_8_)(local_2d8);
                  pFVar21 = local_50;
                } while ((ulong)local_2d8 < local_50);
              }
            }
            else {
LAB_00234e8a:
              (*(code *)args.params)(local_2d8);
LAB_00234e9d:
              pvVar15 = local_48;
              num_params = local_38;
              auVar12 = local_2d8;
              FVar13 = (int)args.memory_size;
              if ((int)args.memory_size != 0) goto LAB_002351db;
            }
          }
          else {
            if ((uVar1 != '/') || (local_50 <= (FT_Face)((long)(FT_Long *)local_2d8 + 2U)))
            goto LAB_00234e8a;
            pFVar21 = (FT_Face)((long)(FT_Long *)local_2d8 + 1);
            local_2d8 = (undefined1  [8])pFVar21;
            (*(code *)args.params)(local_2d8);
            pvVar15 = local_48;
            num_params = local_38;
            FVar13 = (int)args.memory_size;
            if ((int)args.memory_size != 0) goto LAB_002351db;
            auVar12 = local_2d8;
            if (((int)((long)local_2d8 - (long)pFVar21) - 1U < 0x15) &&
               ((ulong)local_2d8 < local_50)) {
              uVar20 = (long)local_2d8 - (long)pFVar21 & 0xffffffff;
              lVar22 = 0;
              do {
                puVar5 = *(uchar **)((long)&t42_keywords[0].ident + lVar22);
                if ((((puVar5 != (uchar *)0x0) && ((uchar)pFVar21->num_faces == *puVar5)) &&
                    (sVar17 = strlen((char *)puVar5), uVar20 == sVar17)) &&
                   (iVar14 = bcmp(pFVar21,puVar5,uVar20), iVar14 == 0)) {
                  iVar14 = *(int *)((long)&t42_keywords[0].type + lVar22);
                  if (iVar14 == 0xb) {
                    (**(code **)((long)&t42_keywords[0].reader + lVar22))(t42face,local_2d8);
                  }
                  else {
                    iVar4 = *(int *)((long)&t42_keywords[0].location + lVar22);
                    local_78[0] = local_40;
                    if ((iVar4 != 2) && (local_78[0] = local_58, iVar4 != 5)) {
                      local_78[0] = local_60;
                    }
                    if (iVar14 - 9U < 2) {
                      args.memory_size._0_4_ = (*local_250)();
                    }
                    else {
                      args.memory_size._0_4_ =
                           (*local_258)(local_2d8,(long)&t42_keywords[0].ident + lVar22,local_78,0,0
                                       );
                    }
                  }
                  goto LAB_00234e9d;
                }
                lVar22 = lVar22 + 0x30;
                auVar12 = local_2d8;
              } while (lVar22 != 0x3c0);
            }
          }
          local_2d8 = auVar12;
          (*(code *)args._48_8_)(local_2d8);
          num_params = local_38;
        } while ((ulong)local_2d8 < local_50);
      }
      local_34 = (int)args.memory_size;
      pvVar15 = local_48;
      FVar13 = local_34;
      if ((int)args.memory_size == 0) {
        if (*(char *)((long)&t42face[2].driver + 1) == '*') {
          local_50 = (FT_Face)(ulong)local_1c0;
          t42face[2].max_advance_width = (undefined2)local_1c0;
          t42face[2].max_advance_height = local_1c0._2_2_;
          if (local_140 == 0) {
            local_34 = 3;
          }
          local_140 = 0;
          t42face[2].generic.finalizer = local_158[0];
          t42face[2].size = local_130;
          t42face[2].charmap = local_128;
          t42face[2].bbox.xMin = local_1b8[0];
          t42face[2].glyph = local_190;
          local_1b8[0] = 0;
          local_40 = (FT_Face)0x0;
          local_190 = (FT_GlyphSlot_conflict)0x0;
          FVar13 = local_34;
          if (*(int *)&t42face[2].style_name == 1) {
            pFVar21 = (FT_Face)(long)local_200;
            local_80 = 0;
            if (0 < (long)pFVar21) {
              pFVar24 = (FT_Face)0x0;
              local_80 = 0;
              local_40 = (FT_Face)0x0;
              local_58 = pFVar21;
              do {
                *(undefined2 *)(*(long *)&t42face[2].num_charmaps + (long)pFVar24 * 2) = 0;
                t42face[2].charmaps[(long)pFVar24] = (FT_CharMap)".notdef";
                pcVar18 = *(char **)(local_1f8 + (long)pFVar24 * 8);
                if (pcVar18 != (char *)0x0 && 0 < (int)local_50) {
                  pFVar6 = t42face[2].glyph;
                  pFVar23 = (FT_Face)0x0;
                  local_60 = pFVar24;
                  do {
                    __s2 = (&pFVar6->library)[(long)pFVar23];
                    iVar14 = strcmp(pcVar18,(char *)__s2);
                    pFVar24 = local_60;
                    if (iVar14 == 0) {
                      *(short *)(*(long *)&t42face[2].num_charmaps + (long)local_60 * 2) =
                           (short)pFVar23;
                      t42face[2].charmaps[(long)local_60] = (FT_CharMap)__s2;
                      iVar14 = strcmp(".notdef",(char *)__s2);
                      pFVar21 = local_58;
                      pvVar15 = local_48;
                      if (iVar14 != 0) {
                        if ((int)pFVar24 < (int)local_40) {
                          local_40 = pFVar24;
                        }
                        local_40 = (FT_Face)((ulong)local_40 & 0xffffffff);
                        iVar14 = (int)local_80;
                        local_80 = local_80 & 0xffffffff;
                        if ((long)iVar14 <= (long)pFVar24) {
                          local_80 = (ulong)((int)pFVar24 + 1);
                        }
                      }
                      break;
                    }
                    pFVar23 = (FT_Face)((long)&pFVar23->num_faces + 1);
                    pFVar21 = local_58;
                    pvVar15 = local_48;
                  } while (local_50 != pFVar23);
                }
                pFVar24 = (FT_Face)((long)&pFVar24->num_faces + 1);
              } while (pFVar24 != pFVar21);
            }
            *(int *)&t42face[2].field_0x3c = (int)local_40;
            *(int *)&t42face[2].available_sizes = (int)local_80;
            t42face[2].num_fixed_sizes = local_228;
            num_params = local_38;
            FVar13 = local_34;
          }
        }
        else {
          local_34 = 2;
          FVar13 = local_34;
        }
      }
    }
    else {
LAB_00234c7a:
      num_params = local_38;
      if (local_230 == '\0') {
        ft_mem_free(memory,local_240);
        local_240 = (FT_Face)0x0;
        pFVar21 = local_240;
        local_240 = (FT_Face)0x0;
        local_34 = (int)local_78[0];
        num_params = local_38;
        FVar13 = local_34;
        if ((int)local_78[0] == 0) goto LAB_00234cc4;
      }
    }
  }
LAB_002351db:
  local_34 = FVar13;
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(local_220);
  }
  FVar11 = local_84;
  if (local_100 != (code *)0x0) {
    (*local_100)(local_158);
  }
  if (local_160 != (code *)0x0) {
    (*local_160)(local_1b8);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(local_f8);
  }
  if (local_230 == '\0') {
    ft_mem_free((FT_Memory)args.pathname,local_240);
  }
  (*(code *)CONCAT44(args.driver._4_4_,(int)args.driver))();
  if (FVar11 < 0 || local_34 != 0) {
    return local_34;
  }
  if ((short)FVar11 != 0) {
    return 6;
  }
  iVar14._0_2_ = t42face[2].max_advance_width;
  iVar14._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar14;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  t42face->face_flags =
       (ulong)(*(char *)&t42face[1].style_name != '\0') << 2 | t42face->face_flags | 0xa11;
  pcVar18 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar18;
  t42face->style_name = "Regular";
  if (pcVar18 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar19 = (char *)t42face[1].face_flags;
    if (pcVar19 != (char *)0x0) {
      while (cVar2 = *pcVar19, cVar2 != '\0') {
        cVar3 = *pcVar18;
        if (cVar2 == cVar3) {
          pcVar18 = pcVar18 + 1;
LAB_00235307:
          pcVar19 = pcVar19 + 1;
        }
        else {
          if ((cVar2 == '-') || (cVar2 == ' ')) goto LAB_00235307;
          if ((cVar3 != ' ') && (cVar3 != '-')) {
            if (cVar3 == '\0') {
              t42face->style_name = pcVar19;
            }
            break;
          }
          pcVar18 = pcVar18 + 1;
        }
      }
    }
  }
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  local_2d8._0_4_ = 9;
  args.stream = (FT_Stream)FT_Get_Module((t42face->driver->root).library,"truetype");
  args._0_8_ = t42face[3].style_name;
  args.memory_base = *(FT_Byte **)&t42face[3].num_fixed_sizes;
  if (num_params != 0) {
    local_2d8._0_4_ = 0x19;
    args._48_8_ = local_98;
    args.driver._0_4_ = num_params;
  }
  FVar13 = FT_Open_Face((t42face->driver->root).library,(FT_Open_Args *)local_2d8,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (FVar13 != 0) {
    return FVar13;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar7 = t42face[3].available_sizes;
  FVar8 = pFVar7[3].x_ppem;
  FVar9 = pFVar7[3].y_ppem;
  FVar10 = *(FT_Pos *)(pFVar7 + 4);
  (t42face->bbox).xMin = pFVar7[3].size;
  (t42face->bbox).yMin = FVar8;
  (t42face->bbox).xMax = FVar9;
  (t42face->bbox).yMax = FVar10;
  t42face->units_per_EM = (FT_UShort)pFVar7[4].size;
  t42face->ascender = *(FT_Short *)((long)&pFVar7[4].size + 2);
  t42face->descender = *(FT_Short *)((long)&pFVar7[4].size + 4);
  t42face->height = *(FT_Short *)((long)&pFVar7[4].size + 6);
  t42face->max_advance_width = (FT_Short)pFVar7[4].x_ppem;
  t42face->max_advance_height = *(FT_Short *)((long)&pFVar7[4].x_ppem + 2);
  t42face->underline_position = *(FT_Short *)((long)&t42face[1].style_name + 2);
  t42face->underline_thickness = *(FT_Short *)((long)&t42face[1].style_name + 4);
  uVar20 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar20;
  if ((pFVar7->y_ppem & 2) != 0) {
    t42face->style_flags = uVar20 | 2;
  }
  if ((pFVar7->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (pvVar15 == (FT_Pointer)0x0) {
switchD_00235503_default:
    FVar13 = 0;
  }
  else {
    puVar25 = *(undefined8 **)(local_90 + 0x40);
    args.flags = 0x756e6963;
    args._4_4_ = 0x10003;
    local_2d8 = (undefined1  [8])t42face;
    FVar13 = FT_CMap_New((FT_CMap_Class)puVar25[3],(FT_Pointer)0x0,(FT_CharMap)local_2d8,
                         (FT_CMap_conflict *)0x0);
    if (FVar13 != 0 && (char)FVar13 != -0x5d) {
      return FVar13;
    }
    switch(*(undefined4 *)&t42face[2].style_name) {
    case 1:
      args.flags = 0x41444243;
      args._4_4_ = 0x20007;
      puVar25 = puVar25 + 2;
      break;
    case 2:
      args.flags = 0x41444f42;
      args._4_4_ = 7;
      break;
    case 3:
      puVar25 = puVar25 + 3;
      args.flags = 0x6c617431;
      args._4_4_ = 0x30007;
      break;
    case 4:
      args.flags = 0x41444245;
      args._4_4_ = 0x10007;
      puVar25 = puVar25 + 1;
      break;
    default:
      goto switchD_00235503_default;
    }
    FVar13 = 0;
    if ((FT_CMap_Class)*puVar25 != (FT_CMap_Class)0x0) {
      FVar13 = FT_CMap_New((FT_CMap_Class)*puVar25,(FT_Pointer)0x0,(FT_CharMap)local_2d8,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }